

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_thread_terminate(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread)

{
  sexp psVar1;
  sexp_conflict psVar2;
  sexp_conflict psVar3;
  sexp_conflict **pppsVar4;
  sexp_conflict psVar5;
  bool bVar6;
  
  bVar6 = ctx == thread;
  if ((((ulong)thread & 3) != 0) || (thread->tag != 0x24)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x24,thread);
    return psVar2;
  }
  do {
    if (0 < (ctx->value).context.refuel) {
      (thread->value).flonum_bits[0x60a4] = '\x01';
      (thread->value).context.result =
           (sexp)(((ctx->value).type.setters)->value).context.mark_stack[9].start;
      (thread->value).context.refuel = 0;
    }
    psVar1 = (ctx->value).type.setters;
    psVar2 = (sexp_conflict)(psVar1->value).context.mark_stack[10].end;
    if (((ulong)psVar2 & 3) == 0) {
      psVar5 = (sexp_conflict)(sexp_conflict *)0x0;
      do {
        psVar3 = psVar2;
        if (psVar3->tag != 6) break;
        if (*(sexp_conflict *)&psVar3->value == thread) {
          psVar2 = *(sexp_conflict *)((long)&psVar3->value + 8);
          pppsVar4 = (sexp_conflict **)((long)psVar5 + 0x10);
          if (psVar5 == (sexp_conflict)0x0) {
            pppsVar4 = &(psVar1->value).context.mark_stack[10].end;
          }
          *pppsVar4 = (sexp_conflict *)psVar2;
          sexp_thread_start(ctx,self,(sexp_sint_t)psVar2,thread);
          break;
        }
        psVar2 = *(sexp_conflict *)((long)&psVar3->value + 8);
        psVar5 = psVar3;
      } while (((ulong)psVar2 & 3) == 0);
    }
    thread = (thread->value).type.getters;
    if (((thread == (sexp)0x0) || (((ulong)thread & 3) != 0)) || (thread->tag != 0x24)) {
      return (sexp_conflict)((ulong)bVar6 << 8 | 0x3e);
    }
  } while( true );
}

Assistant:

sexp sexp_thread_terminate (sexp ctx, sexp self, sexp_sint_t n, sexp thread) {
  sexp res = sexp_make_boolean(ctx == thread);
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  /* terminate the thread and all children */
  for ( ; thread && sexp_contextp(thread); thread=sexp_context_child(thread)) {
    /* if not already terminated set an exception status */
    if (sexp_context_refuel(ctx) > 0) {
      sexp_context_errorp(thread) = 1;
      sexp_context_result(thread) =
        sexp_global(ctx, SEXP_G_THREAD_TERMINATE_ERROR);
      /* zero the refuel - this tells the scheduler the thread is terminated */
      sexp_context_refuel(thread) = 0;
    }
    /* unblock the thread if needed so it can be scheduled and terminated */
    if (sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread))
      sexp_thread_start(ctx, self, 1, thread);
  }
  /* return true if terminating self, then we can yield */
  return res;
}